

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-capnp.c++
# Opt level: O2

StringTree * __thiscall
capnp::anon_unknown_1::CapnpcCapnpMain::nodeName
          (StringTree *__return_storage_ptr__,CapnpcCapnpMain *this,Schema target,Schema scope,
          Reader brand,Maybe<capnp::InterfaceSchema::Method> *method)

{
  SchemaLoader *this_00;
  bool bVar1;
  Reader brand_00;
  undefined1 auVar2 [40];
  Reader brand_01;
  Reader brand_02;
  Reader type;
  NullableValue<capnp::InterfaceSchema::Method> *pNVar3;
  undefined4 uVar4;
  Branch *pBVar5;
  int iVar6;
  int iVar7;
  _Rb_tree_color _Var8;
  mapped_type *pmVar9;
  Schema SVar10;
  SegmentReader *pSVar11;
  size_type sVar12;
  long lVar13;
  iterator iVar14;
  long lVar15;
  Reader *params;
  char (*params_00) [18];
  size_t count;
  uint64_t uVar16;
  Maybe<capnp::InterfaceSchema::Method> *params_2;
  char (*in_R9) [2];
  IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
  IVar17;
  StringPtr delim;
  StringPtr delim_00;
  Array<kj::StringTree> bindings;
  ArrayBuilder<kj::StringTree> parts;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnpc_capnp_c__:110:5)>
  _kjContext110;
  Vector<capnp::Schema> targetPath;
  Schema part;
  IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
  local_2a8;
  Reader proto_1;
  Vector<capnp::Schema> scopeParts;
  Reader nested;
  undefined1 local_218 [32];
  Branch *local_1f8;
  size_t sStack_1f0;
  Reader scopeBrand;
  Schema target_local;
  Schema parent_2;
  anon_class_8_1_a879b908 _kjContextFunc110;
  Schema local_170;
  StringTree partStr;
  StringTree local_128;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  map<unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>_>
  scopeBindings;
  Reader proto;
  
  targetPath.builder.ptr = (Schema *)0x0;
  targetPath.builder.pos = (RemoveConst<capnp::Schema> *)0x0;
  targetPath.builder.endPtr = (Schema *)0x0;
  scopeParts.builder.ptr = (Schema *)0x0;
  scopeParts.builder.pos = (RemoveConst<capnp::Schema> *)0x0;
  scopeParts.builder.endPtr = (Schema *)0x0;
  params_2 = method;
  target_local = target;
  kj::Vector<capnp::Schema>::add<capnp::Schema&>(&targetPath,&target_local);
  scopeBindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &scopeBindings._M_t._M_impl.super__Rb_tree_header._M_header;
  scopeBindings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  scopeBindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  scopeBindings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  scopeBindings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       scopeBindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  capnp::schema::Brand::Reader::getScopes((Reader *)&_kjContext110,&brand);
  uVar4 = _kjContext110.super_Context.value.ptr._0_4_;
  proto_1._reader.segment = (SegmentReader *)&_kjContext110;
  for (proto_1._reader.capTable._0_4_ = 0; (int)proto_1._reader.capTable != uVar4;
      proto_1._reader.capTable._0_4_ = (int)proto_1._reader.capTable + 1) {
    _::
    IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
    ::operator*(&scopeBrand,
                (IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
                 *)&proto_1);
    if ((scopeBrand._reader.dataSize < 0x50) || (*(short *)((long)scopeBrand._reader.data + 8) == 0)
       ) {
      capnp::schema::Brand::Scope::Reader::getBind((Reader *)&partStr,&scopeBrand);
      if (scopeBrand._reader.dataSize < 0x40) {
        local_218._0_8_ = (SegmentReader *)0x0;
      }
      else {
        local_218._0_8_ = *scopeBrand._reader.data;
      }
      pmVar9 = std::
               map<unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>_>
               ::operator[](&scopeBindings,(key_type *)local_218);
      *(Branch **)&(pmVar9->reader).structDataSize = partStr.branches.ptr;
      *(size_t *)&(pmVar9->reader).nestingLimit = partStr.branches.size_;
      (pmVar9->reader).ptr = (byte *)partStr.text.content.size_;
      *(ArrayDisposer **)&(pmVar9->reader).elementCount = partStr.text.content.disposer;
      (pmVar9->reader).segment = (SegmentReader *)partStr.size_;
      (pmVar9->reader).capTable = (CapTableReader *)partStr.text.content.ptr;
    }
  }
  scopeBrand._reader.segment = (SegmentReader *)target_local.raw;
  this_00 = &this->schemaLoader;
  while( true ) {
    Schema::getProto((Reader *)&_kjContext110,(Schema *)&scopeBrand);
    if (((uint)_kjContext110.super_Context.value.ptr.field_1._0_4_ < 0xc0) ||
       (*(long *)(_kjContext110.super_Context._16_8_ + 0x10) == 0)) break;
    Schema::getProto((Reader *)&_kjContext110,(Schema *)&scopeBrand);
    if ((uint)_kjContext110.super_Context.value.ptr.field_1._0_4_ < 0xc0) {
      uVar16 = 0;
    }
    else {
      uVar16 = *(uint64_t *)(_kjContext110.super_Context._16_8_ + 0x10);
    }
    local_a8 = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    local_c8 = 0;
    uStack_c0 = 0;
    uStack_a0 = 0x7fffffff;
    auVar2 = ZEXT1640(ZEXT816(0));
    brand_00._reader._40_8_ = 0x7fffffff;
    brand_00._reader.segment = (SegmentReader *)auVar2._0_8_;
    brand_00._reader.capTable = (CapTableReader *)auVar2._8_8_;
    brand_00._reader.data = (void *)auVar2._16_8_;
    brand_00._reader.pointers = (WirePointer *)auVar2._24_8_;
    brand_00._reader.dataSize = auVar2._32_4_;
    brand_00._reader.pointerCount = auVar2._36_2_;
    brand_00._reader._38_2_ = auVar2._38_2_;
    scopeBrand._reader.segment =
         (SegmentReader *)SchemaLoader::get(this_00,uVar16,brand_00,(Schema)0x1d4ce0);
    kj::Vector<capnp::Schema>::add<capnp::Schema&>(&targetPath,(Schema *)&scopeBrand);
  }
  scopeBrand._reader.segment = (SegmentReader *)scope.raw;
  kj::Vector<capnp::Schema>::add<capnp::Schema&>(&scopeParts,(Schema *)&scopeBrand);
  while( true ) {
    Schema::getProto((Reader *)&_kjContext110,(Schema *)&scopeBrand);
    if (((uint)_kjContext110.super_Context.value.ptr.field_1._0_4_ < 0xc0) ||
       (*(long *)(_kjContext110.super_Context._16_8_ + 0x10) == 0)) break;
    Schema::getProto((Reader *)&_kjContext110,(Schema *)&scopeBrand);
    if ((uint)_kjContext110.super_Context.value.ptr.field_1._0_4_ < 0xc0) {
      uVar16 = 0;
    }
    else {
      uVar16 = *(uint64_t *)(_kjContext110.super_Context._16_8_ + 0x10);
    }
    local_d8 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    local_128.branches.disposer = (ArrayDisposer *)0x0;
    uStack_f0 = 0;
    uStack_d0 = 0x7fffffff;
    auVar2 = ZEXT1640(ZEXT816(0));
    brand_01._reader._40_8_ = 0x7fffffff;
    brand_01._reader.segment = (SegmentReader *)auVar2._0_8_;
    brand_01._reader.capTable = (CapTableReader *)auVar2._8_8_;
    brand_01._reader.data = (void *)auVar2._16_8_;
    brand_01._reader.pointers = (WirePointer *)auVar2._24_8_;
    brand_01._reader.dataSize = auVar2._32_4_;
    brand_01._reader.pointerCount = auVar2._36_2_;
    brand_01._reader._38_2_ = auVar2._38_2_;
    SVar10 = SchemaLoader::get(this_00,uVar16,brand_01,(Schema)0x1d4ce0);
    scopeBrand._reader.segment = (SegmentReader *)SVar10.raw;
    kj::Vector<capnp::Schema>::add<capnp::Schema&>(&scopeParts,(Schema *)&scopeBrand);
  }
  for (; ((scopeParts.builder.pos != scopeParts.builder.ptr &&
          (8 < (ulong)((long)targetPath.builder.pos - (long)targetPath.builder.ptr))) &&
         (scopeParts.builder.pos[-1].raw == targetPath.builder.pos[-1].raw));
      scopeParts.builder.pos = scopeParts.builder.pos + -1) {
    Schema::getProto((Reader *)&_kjContext110,scopeParts.builder.pos + -1);
    if ((uint)_kjContext110.super_Context.value.ptr.field_1._0_4_ < 0x40) {
      pSVar11 = (SegmentReader *)0x0;
    }
    else {
      pSVar11 = *(SegmentReader **)_kjContext110.super_Context._16_8_;
    }
    scopeBrand._reader.segment = pSVar11;
    sVar12 = std::
             map<unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>_>
             ::count(&scopeBindings,(key_type *)&scopeBrand);
    if (sVar12 != 0) break;
    targetPath.builder.pos = targetPath.builder.pos + -1;
  }
  count = (long)targetPath.builder.pos - (long)targetPath.builder.ptr >> 3;
  parts.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringTree>(count);
  parts.endPtr = parts.ptr + count;
  parts.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  parts.pos = parts.ptr;
  do {
    if (targetPath.builder.pos == targetPath.builder.ptr) {
      _kjContext110.super_Context.super_ExceptionCallback.next =
           (ExceptionCallback *)(((long)parts.pos - (long)parts.ptr) / 0x38);
      _kjContext110.super_Context.super_ExceptionCallback._vptr_ExceptionCallback =
           (_func_int **)parts.ptr;
      _kjContext110.super_Context._16_8_ = parts.disposer;
      parts.ptr = (StringTree *)0x0;
      parts.pos = (RemoveConst<kj::StringTree> *)0x0;
      parts.endPtr = (StringTree *)0x0;
      delim_00.content.size_ = 2;
      delim_00.content.ptr = ".";
      kj::StringTree::StringTree
                (__return_storage_ptr__,(Array<kj::StringTree> *)&_kjContext110,delim_00);
      kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)&_kjContext110);
      kj::ArrayBuilder<kj::StringTree>::dispose(&parts);
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>,_std::_Select1st<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>_>
      ::~_Rb_tree(&scopeBindings._M_t);
      kj::ArrayBuilder<capnp::Schema>::dispose(&scopeParts.builder);
      kj::ArrayBuilder<capnp::Schema>::dispose(&targetPath.builder);
      return __return_storage_ptr__;
    }
    part.raw = targetPath.builder.pos[-1].raw;
    Schema::getProto(&proto,&part);
    partStr.branches.ptr = (Branch *)0x0;
    partStr.branches.size_ = 0;
    partStr.branches.disposer = (ArrayDisposer *)0x0;
    partStr.text.content.size_ = 0;
    partStr.text.content.disposer = (ArrayDisposer *)0x0;
    partStr.size_ = 0;
    partStr.text.content.ptr = (char *)0x0;
    if ((proto._reader.dataSize < 0xc0) || (*(long *)((long)proto._reader.data + 0x10) == 0)) {
      scopeBrand._reader._0_16_ = capnp::schema::Node::Reader::getDisplayName(&proto);
      proto_1._reader.segment = (SegmentReader *)CONCAT71(proto_1._reader.segment._1_7_,0x22);
      kj::strTree<char_const(&)[10],capnp::Text::Reader,char>
                ((StringTree *)&_kjContext110,(kj *)"import \"/",(char (*) [10])&scopeBrand,
                 (Reader *)&proto_1,(char *)params_2);
      kj::StringTree::operator=(&partStr,(StringTree *)&_kjContext110);
      kj::StringTree::~StringTree((StringTree *)&_kjContext110);
    }
    else {
      local_170.raw = part.raw;
      Schema::getProto(&proto_1,&local_170);
      _kjContextFunc110.proto = &proto_1;
      kj::_::Debug::Context::Context(&_kjContext110.super_Context);
      _kjContext110.super_Context.super_ExceptionCallback._vptr_ExceptionCallback =
           (_func_int **)&PTR__Context_001d33a0;
      _kjContext110.func = &_kjContextFunc110;
      if (proto_1._reader.dataSize < 0xc0) {
        uVar16 = 0;
      }
      else {
        uVar16 = *(uint64_t *)((long)proto_1._reader.data + 0x10);
      }
      local_1f8 = (Branch *)0x0;
      local_218._16_8_ = (short *)0x0;
      local_218._24_8_ = (WirePointer *)0x0;
      local_218._0_8_ = (SegmentReader *)0x0;
      local_218._8_8_ = (CapTableReader *)0x0;
      sStack_1f0 = 0x7fffffff;
      auVar2 = ZEXT1640(ZEXT816(0));
      brand_02._reader._40_8_ = 0x7fffffff;
      brand_02._reader.segment = (SegmentReader *)auVar2._0_8_;
      brand_02._reader.capTable = (CapTableReader *)auVar2._8_8_;
      brand_02._reader.data = (void *)auVar2._16_8_;
      brand_02._reader.pointers = (WirePointer *)auVar2._24_8_;
      brand_02._reader.dataSize = auVar2._32_4_;
      brand_02._reader.pointerCount = auVar2._36_2_;
      brand_02._reader._38_2_ = auVar2._38_2_;
      parent_2 = SchemaLoader::get(this_00,uVar16,brand_02,(Schema)0x1d4ce0);
      Schema::getProto((Reader *)&nested,&parent_2);
      capnp::schema::Node::Reader::getNestedNodes((Reader *)&local_128,(Reader *)&nested);
      iVar6 = (int)local_128.text.content.disposer;
      bindings.size_ = bindings.size_ & 0xffffffff00000000;
      iVar7 = 0;
      bindings.ptr = &local_128;
      while( true ) {
        if (iVar7 == iVar6) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[73]>
                    ((Fault *)&local_128,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnpc-capnp.c++"
                     ,0x75,FAILED,(char *)0x0,
                     "\"A schema Node\'s supposed scope did not contain the node as a NestedNode.\""
                     ,(char (*) [73])
                      "A schema Node\'s supposed scope did not contain the node as a NestedNode.");
          kj::_::Debug::Fault::fatal((Fault *)&local_128);
        }
        _::
        IndexingIterator<const_capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Reader,_capnp::schema::Node::NestedNode::Reader>
        ::operator*(&nested,(IndexingIterator<const_capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Reader,_capnp::schema::Node::NestedNode::Reader>
                             *)&bindings);
        if (nested._reader.dataSize < 0x40) {
          lVar13 = 0;
        }
        else {
          lVar13 = *nested._reader.data;
        }
        if (proto_1._reader.dataSize < 0x40) {
          lVar15 = 0;
        }
        else {
          lVar15 = *proto_1._reader.data;
        }
        if (lVar13 == lVar15) break;
        iVar7 = (int)bindings.size_ + 1;
        bindings.size_ = CONCAT44(bindings.size_._4_4_,iVar7);
      }
      IVar17 = (IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
                )capnp::schema::Node::NestedNode::Reader::getName(&nested);
      kj::_::Debug::Context::~Context(&_kjContext110.super_Context);
      local_2a8 = IVar17;
      kj::strTree<capnp::Text::Reader>((StringTree *)&scopeBrand,(kj *)&local_2a8,params);
      kj::StringTree::operator=(&partStr,(StringTree *)&scopeBrand);
      kj::StringTree::~StringTree((StringTree *)&scopeBrand);
    }
    if (proto._reader.dataSize < 0x40) {
      _kjContext110.super_Context.super_ExceptionCallback._vptr_ExceptionCallback =
           (_func_int **)0x0;
    }
    else {
      _kjContext110.super_Context.super_ExceptionCallback._vptr_ExceptionCallback =
           *proto._reader.data;
    }
    iVar14 = std::
             _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>,_std::_Select1st<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>_>
             ::find(&scopeBindings._M_t,(key_type *)&_kjContext110);
    if ((_Rb_tree_header *)iVar14._M_node != &scopeBindings._M_t._M_impl.super__Rb_tree_header) {
      _Var8 = iVar14._M_node[2]._M_color;
      nested._reader.segment =
           (SegmentReader *)
           kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringTree>((ulong)_Var8);
      nested._reader.data = (void *)((long)nested._reader.segment + (ulong)_Var8 * 0x38);
      nested._reader.pointers = (WirePointer *)&kj::_::HeapArrayDisposer::instance;
      local_2a8.container = (Reader *)&iVar14._M_node[1]._M_parent;
      _Var8 = _S_red;
      nested._reader.capTable = (CapTableReader *)nested._reader.segment;
      while (local_2a8.index = _Var8, _Var8 != iVar14._M_node[2]._M_color) {
        _::
        IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
        ::operator*((Reader *)&local_128,&local_2a8);
        local_218._24_8_ =
             CONCAT44(local_128.text.content.disposer._4_4_,(int)local_128.text.content.disposer);
        local_1f8 = local_128.branches.ptr;
        pBVar5 = local_1f8;
        sStack_1f0 = local_128.branches.size_;
        local_218._0_8_ = local_128.size_;
        local_218._8_8_ = local_128.text.content.ptr;
        local_218._16_8_ = local_128.text.content.size_;
        local_1f8._0_4_ = (uint)local_128.branches.ptr;
        local_1f8 = pBVar5;
        if ((uint)local_1f8 < 0x10) {
LAB_0014d9a7:
          kj::strTree<char_const(&)[11]>
                    ((StringTree *)&scopeBrand,(kj *)0x1aaad6,(char (*) [11])params_00);
        }
        else if (*(short *)local_128.text.content.size_ == 1) {
          capnp::schema::Brand::Binding::Reader::getType((Reader *)&proto_1,(Reader *)local_218);
          bVar1 = (method->ptr).isSet;
          _kjContext110.super_Context.super_ExceptionCallback._vptr_ExceptionCallback =
               (_func_int **)
               CONCAT71(_kjContext110.super_Context.super_ExceptionCallback._vptr_ExceptionCallback.
                        _1_7_,bVar1);
          if (bVar1 == true) {
            _kjContext110.super_Context.super_ExceptionCallback.next =
                 (ExceptionCallback *)(method->ptr).field_1.value.parent.super_Schema.raw;
            _kjContext110.super_Context._16_8_ = *(undefined8 *)((long)&(method->ptr).field_1 + 8);
            _kjContext110.super_Context.value.ptr._0_8_ =
                 (method->ptr).field_1.value.proto._reader.segment;
            _kjContext110.super_Context.value.ptr.field_1.value.file =
                 (char *)(method->ptr).field_1.value.proto._reader.capTable;
            _kjContext110.super_Context.value.ptr.field_1._8_8_ =
                 (method->ptr).field_1.value.proto._reader.data;
            _kjContext110.super_Context.value.ptr.field_1.value.description.content.ptr =
                 (char *)(method->ptr).field_1.value.proto._reader.pointers;
            pNVar3 = &method->ptr;
            _kjContext110.super_Context.value.ptr.field_1._24_4_ =
                 *(StructDataBitCount *)((long)&pNVar3->field_1 + 0x30);
            _kjContext110.super_Context.value.ptr.field_1._28_2_ =
                 *(StructPointerCount *)((long)&pNVar3->field_1 + 0x34);
            _kjContext110.super_Context.value.ptr.field_1._30_2_ =
                 *(undefined2 *)((long)&pNVar3->field_1 + 0x36);
            _kjContext110.super_Context.value.ptr.field_1.value.description.content.disposer =
                 (ArrayDisposer *)
                 *(undefined8 *)&(method->ptr).field_1.value.proto._reader.nestingLimit;
          }
          type._reader.capTable._4_4_ = proto_1._reader.capTable._4_4_;
          type._reader.capTable._0_4_ = (int)proto_1._reader.capTable;
          type._reader.pointerCount = proto_1._reader.pointerCount;
          type._reader._38_2_ = proto_1._reader._38_2_;
          type._reader.dataSize = proto_1._reader.dataSize;
          type._reader.segment = proto_1._reader.segment;
          type._reader.data = proto_1._reader.data;
          type._reader.pointers = proto_1._reader.pointers;
          type._reader.nestingLimit = proto_1._reader.nestingLimit;
          type._reader._44_4_ = proto_1._reader._44_4_;
          genType((StringTree *)&scopeBrand,this,type,scope,
                  (Maybe<capnp::InterfaceSchema::Method> *)&_kjContext110);
        }
        else {
          if (*(short *)local_128.text.content.size_ == 0) goto LAB_0014d9a7;
          kj::strTree<char_const(&)[18]>
                    ((StringTree *)&scopeBrand,(kj *)"<unknown binding>",params_00);
        }
        kj::StringTree::StringTree((StringTree *)nested._reader.capTable,(StringTree *)&scopeBrand);
        nested._reader.capTable = nested._reader.capTable + 7;
        kj::StringTree::~StringTree((StringTree *)&scopeBrand);
        _Var8 = local_2a8.index + _S_black;
      }
      bindings.size_ = ((long)nested._reader.capTable - (long)nested._reader.segment) / 0x38;
      bindings.ptr = (StringTree *)nested._reader.segment;
      bindings.disposer = (ArrayDisposer *)nested._reader.pointers;
      nested._reader.segment = (SegmentReader *)0x0;
      nested._reader.capTable = (CapTableReader *)0x0;
      nested._reader.data = (void *)0x0;
      kj::ArrayBuilder<kj::StringTree>::dispose((ArrayBuilder<kj::StringTree> *)&nested);
      delim.content.size_ = 3;
      delim.content.ptr = ", ";
      kj::StringTree::StringTree((StringTree *)&scopeBrand,&bindings,delim);
      params_2 = (Maybe<capnp::InterfaceSchema::Method> *)0x1a9b4b;
      kj::strTree<kj::StringTree,char_const(&)[2],kj::StringTree,char_const(&)[2]>
                ((StringTree *)&_kjContext110,(kj *)&partStr,(StringTree *)0x19d8af,
                 (char (*) [2])&scopeBrand,(StringTree *)0x1a9b4b,in_R9);
      kj::StringTree::operator=(&partStr,(StringTree *)&_kjContext110);
      kj::StringTree::~StringTree((StringTree *)&_kjContext110);
      kj::StringTree::~StringTree((StringTree *)&scopeBrand);
      kj::Array<kj::StringTree>::~Array(&bindings);
    }
    kj::StringTree::StringTree(parts.pos,&partStr);
    parts.pos = parts.pos + 1;
    targetPath.builder.pos = targetPath.builder.pos + -1;
    kj::StringTree::~StringTree(&partStr);
  } while( true );
}

Assistant:

kj::StringTree nodeName(Schema target, Schema scope, schema::Brand::Reader brand,
                          kj::Maybe<InterfaceSchema::Method> method) {
    kj::Vector<Schema> targetPath;
    kj::Vector<Schema> scopeParts;

    targetPath.add(target);

    std::map<uint64_t, List<schema::Brand::Binding>::Reader> scopeBindings;
    for (auto scopeBrand: brand.getScopes()) {
      switch (scopeBrand.which()) {
        case schema::Brand::Scope::BIND:
          scopeBindings[scopeBrand.getScopeId()] = scopeBrand.getBind();
          break;
        case schema::Brand::Scope::INHERIT:
          // TODO(someday): We need to pay attention to INHERIT and be sure to explicitly override
          //   any bindings that are not inherited. This requires a way to determine which of our
          //   parent scopes have a non-empty parameter list.
          break;
      }
    }

    {
      Schema parent = target;
      while (parent.getProto().getScopeId() != 0) {
        parent = schemaLoader.get(parent.getProto().getScopeId());
        targetPath.add(parent);
      }
    }

    {
      Schema parent = scope;
      scopeParts.add(parent);
      while (parent.getProto().getScopeId() != 0) {
        parent = schemaLoader.get(parent.getProto().getScopeId());
        scopeParts.add(parent);
      }
    }

    // Remove common scope (unless it has been reparameterized).
    // TODO(someday):  This is broken in that we aren't checking for shadowing.
    while (!scopeParts.empty() && targetPath.size() > 1 &&
           scopeParts.back() == targetPath.back() &&
           scopeBindings.count(scopeParts.back().getProto().getId()) == 0) {
      scopeParts.removeLast();
      targetPath.removeLast();
    }

    auto parts = kj::heapArrayBuilder<kj::StringTree>(targetPath.size());
    while (!targetPath.empty()) {
      auto part = targetPath.back();
      auto proto = part.getProto();
      kj::StringTree partStr;
      if (proto.getScopeId() == 0) {
        partStr = kj::strTree("import \"/", proto.getDisplayName(), '\"');
      } else {
        partStr = kj::strTree(getUnqualifiedName(part));
      }

      auto iter = scopeBindings.find(proto.getId());
      if (iter != scopeBindings.end()) {
        auto bindings = KJ_MAP(binding, iter->second) {
          switch (binding.which()) {
            case schema::Brand::Binding::UNBOUND:
              return kj::strTree("AnyPointer");
            case schema::Brand::Binding::TYPE:
              return genType(binding.getType(), scope, method);
          }
          return kj::strTree("<unknown binding>");
        };
        partStr = kj::strTree(kj::mv(partStr), "(", kj::StringTree(kj::mv(bindings), ", "), ")");
      }

      parts.add(kj::mv(partStr));
      targetPath.removeLast();
    }

    return kj::StringTree(parts.finish(), ".");
  }